

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_util.cpp
# Opt level: O0

bool saveToFile(string *filePath,void *data,size_t dataSize)

{
  undefined8 uVar1;
  long in_RSI;
  _Ios_Openmode in_EDI;
  failure *e;
  ofstream file;
  long local_220 [65];
  long local_18;
  _Ios_Openmode local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_EDI;
  std::ofstream::ofstream(local_220);
  uVar1 = *(undefined8 *)(local_220[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_220 + (int)uVar1);
  std::operator|(_S_out,_S_bin);
  std::ofstream::open((string *)local_220,local_10);
  std::ostream::write((char *)local_220,local_18);
  std::ofstream::close();
  local_1 = 1;
  std::ofstream::~ofstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool saveToFile(const std::string& filePath, const void* data, size_t dataSize)
{
	try {
		std::ofstream file;
		file.exceptions(std::ofstream::failbit | std::ofstream::badbit);
		file.open(filePath, std::ofstream::out | std::ofstream::binary);
		file.write(reinterpret_cast<const char*>(data), dataSize);
		file.close();
		return true;
	}
	catch (const std::ios_base::failure& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}